

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

OrthographicCamera *
pbrt::OrthographicCamera::Create
          (ParameterDictionary *parameters,CameraTransform *cameraTransform,Film *film,
          Medium *medium,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  Tuple2<pbrt::Point2,_int> this;
  size_type sVar2;
  reference pvVar3;
  OrthographicCamera *pOVar4;
  ParameterDictionary *in_RDI;
  Float FVar5;
  float fVar6;
  Float FVar7;
  vector<float,_std::allocator<float>_> sw;
  Bounds2f screen;
  Float frame;
  Float focaldistance;
  Float lensradius;
  CameraBaseParameters cameraBaseParameters;
  string *in_stack_fffffffffffffad8;
  ParameterDictionary *in_stack_fffffffffffffae0;
  Bounds2<float> *in_stack_fffffffffffffaf0;
  Bounds2<float> *args_1;
  allocator<char> *in_stack_fffffffffffffb10;
  ParameterDictionary *__a;
  char *in_stack_fffffffffffffb18;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  FileLoc *in_stack_fffffffffffffb78;
  ParameterDictionary *in_stack_fffffffffffffb80;
  Medium *in_stack_fffffffffffffb88;
  Film *in_stack_fffffffffffffb90;
  CameraTransform *in_stack_fffffffffffffb98;
  CameraBaseParameters *in_stack_fffffffffffffba0;
  vector<float,_std::allocator<float>_> local_458;
  value_type local_43c;
  value_type local_438;
  value_type local_434;
  value_type local_430;
  Tuple2<pbrt::Point2,_int> local_42c;
  Tuple2<pbrt::Point2,_int> local_424;
  allocator<char> local_419;
  string local_418 [32];
  float local_3f8;
  allocator<char> local_3f1;
  string local_3f0 [32];
  Float local_3d0;
  allocator<char> local_3b9;
  string local_3b8 [36];
  Float local_394;
  ParameterDictionary *local_10;
  
  local_10 = in_RDI;
  Film::Film((Film *)in_stack_fffffffffffffae0,(Film *)in_stack_fffffffffffffad8);
  Medium::Medium((Medium *)in_stack_fffffffffffffae0,(Medium *)in_stack_fffffffffffffad8);
  CameraBaseParameters::CameraBaseParameters
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),in_stack_fffffffffffffb18
             ,in_stack_fffffffffffffb10);
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,0.0);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  local_394 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),in_stack_fffffffffffffb18
             ,in_stack_fffffffffffffb10);
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,0.0);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  __s = &local_419;
  __a = local_10;
  local_3d0 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(FVar5,in_stack_fffffffffffffb20),(char *)__s,(allocator<char> *)__a);
  local_424 = (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)in_stack_fffffffffffffad8);
  fVar6 = (float)local_424.x;
  this = (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)in_stack_fffffffffffffad8);
  local_42c = this;
  FVar7 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,0.0);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator(&local_419);
  local_3f8 = FVar7;
  Bounds2<float>::Bounds2(in_stack_fffffffffffffaf0);
  if (local_3f8 <= 1.0) {
    local_43c = -1.0;
    local_434 = 1.0;
    local_438 = -1.0 / local_3f8;
    local_430 = 1.0 / local_3f8;
  }
  else {
    local_43c = -local_3f8;
    local_434 = local_3f8;
    local_438 = -1.0;
    local_430 = 1.0;
  }
  args_1 = (Bounds2<float> *)&stack0xfffffffffffffb87;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(FVar5,in_stack_fffffffffffffb20),(char *)__s,(allocator<char> *)__a);
  ParameterDictionary::GetFloatArray(local_10,(string *)in_stack_fffffffffffffae0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb87);
  bVar1 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)args_1);
  if (!bVar1) {
    if ((*(byte *)(Options + 0xd) & 1) == 0) {
      sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_458);
      if (sVar2 == 4) {
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,0);
        local_43c = *pvVar3;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,1);
        local_434 = *pvVar3;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,2);
        local_438 = *pvVar3;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,3);
        local_430 = *pvVar3;
      }
      else {
        Error<>((char *)__a);
      }
    }
    else {
      Warning<>((char *)__a);
    }
  }
  pOVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::OrthographicCamera,pbrt::CameraBaseParameters&,pbrt::Bounds2<float>&,float&,float&>
                     ((polymorphic_allocator<std::byte> *)this,
                      (CameraBaseParameters *)CONCAT44(fVar6,FVar7),args_1,(float *)local_10,
                      (float *)in_stack_fffffffffffffae0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)args_1);
  return pOVar4;
}

Assistant:

OrthographicCamera *OrthographicCamera::Create(const ParameterDictionary &parameters,
                                               const CameraTransform &cameraTransform,
                                               Film film, Medium medium,
                                               const FileLoc *loc, Allocator alloc) {
    CameraBaseParameters cameraBaseParameters(cameraTransform, film, medium, parameters,
                                              loc);

    Float lensradius = parameters.GetOneFloat("lensradius", 0.f);
    Float focaldistance = parameters.GetOneFloat("focaldistance", 1e6f);
    Float frame =
        parameters.GetOneFloat("frameaspectratio", Float(film.FullResolution().x) /
                                                       Float(film.FullResolution().y));
    Bounds2f screen;
    if (frame > 1.f) {
        screen.pMin.x = -frame;
        screen.pMax.x = frame;
        screen.pMin.y = -1.f;
        screen.pMax.y = 1.f;
    } else {
        screen.pMin.x = -1.f;
        screen.pMax.x = 1.f;
        screen.pMin.y = -1.f / frame;
        screen.pMax.y = 1.f / frame;
    }
    std::vector<Float> sw = parameters.GetFloatArray("screenwindow");
    if (!sw.empty()) {
        if (Options->fullscreen) {
                Warning("\"screenwindow\" is ignored in fullscreen mode");
        } else {
            if (sw.size() == 4) {
                screen.pMin.x = sw[0];
                screen.pMax.x = sw[1];
                screen.pMin.y = sw[2];
                screen.pMax.y = sw[3];
            } else {
                Error("\"screenwindow\" should have four values");
            }
        }
    }
    return alloc.new_object<OrthographicCamera>(cameraBaseParameters, screen, lensradius,
                                                focaldistance);
}